

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O2

void __thiscall AsyncLogging::AsyncLogging(AsyncLogging *this,string *logName,int flushInterval)

{
  MutexLock *this_00;
  FixedBuffer<4000000> *__p;
  _Bind<void_(AsyncLogging::*(AsyncLogging_*))()> local_a8;
  ThreadFunc local_90;
  string local_70;
  string *local_50;
  Thread *local_48;
  MutexLock *local_40;
  allocator local_31;
  
  this->flushInterval_ = flushInterval;
  this->running_ = false;
  std::__cxx11::string::string((string *)&this->basename_,(string *)logName);
  local_a8._M_f = (offset_in_AsyncLogging_to_subr)threadFunc;
  local_a8._8_8_ = 0;
  local_a8._M_bound_args.super__Tuple_impl<0UL,_AsyncLogging_*>.
  super__Head_base<0UL,_AsyncLogging_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_AsyncLogging_*>)(_Tuple_impl<0UL,_AsyncLogging_*>)this;
  local_50 = &this->basename_;
  std::function<void()>::function<std::_Bind<void(AsyncLogging::*(AsyncLogging*))()>,void>
            ((function<void()> *)&local_90,&local_a8);
  std::__cxx11::string::string((string *)&local_70,"Logging",&local_31);
  Thread::Thread(&this->thread_,&local_90,&local_70);
  local_48 = &this->thread_;
  std::__cxx11::string::~string((string *)&local_70);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  this_00 = &this->mutex_;
  MutexLock::MutexLock(this_00);
  local_40 = this_00;
  Condition::Condition(&this->cond_,this_00);
  __p = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  __p->cur_ = (char *)__p;
  std::__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<FixedBuffer<4000000>,void>
            ((__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)&this->currentBuffer_,
             __p);
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CountDownLatch::CountDownLatch(&this->latch_,1);
  if (1 < logName->_M_string_length) {
    memset((this->currentBuffer_).
           super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,4000000);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::reserve(&this->buffers_,0x10);
    return;
  }
  __assert_fail("logName.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                ,0x10,"AsyncLogging::AsyncLogging(std::string, int)");
}

Assistant:

AsyncLogging::AsyncLogging(std::string logName, int flushInterval) 
    : flushInterval_(flushInterval),
      running_(false),
      basename_(logName),
      thread_(std::bind(&AsyncLogging::threadFunc, this), "Logging"),
      mutex_(),
      cond_(mutex_), 
      currentBuffer_(new Buffer),
      buffers_(),
      latch_(1) {
    assert(logName.size() > 1);
    currentBuffer_->bzero();
    buffers_.reserve(16);
}